

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

bool __thiscall
google::protobuf::EnumOptions::MergePartialFromCodedStream
          (EnumOptions *this,CodedInputStream *input)

{
  InternalMetadataWithArena *this_00;
  byte *pbVar1;
  void *pvVar2;
  uint8 *puVar3;
  bool bVar4;
  byte bVar5;
  uint uVar6;
  int byte_limit;
  uint32 uVar7;
  Type *this_01;
  pair<int,_int> pVar8;
  byte *pbVar9;
  bool *pbVar10;
  UnknownFieldSet *pUVar11;
  char cVar12;
  uint uVar13;
  ulong uVar14;
  pair<unsigned_long,_bool> pVar15;
  
  this_00 = &this->_internal_metadata_;
LAB_003c1822:
  pbVar9 = input->buffer_;
  uVar7 = 0;
  if (pbVar9 < input->buffer_end_) {
    bVar5 = *pbVar9;
    uVar7 = (uint32)bVar5;
    pbVar1 = pbVar9 + 1;
    uVar13 = (uint)bVar5;
    if ((char)bVar5 < '\x01') {
      if ((input->buffer_end_ <= pbVar1) || ((~(uint)*pbVar1 & uVar13) < 0x80)) goto LAB_003c1a2a;
      uVar13 = ((uint)bVar5 + (uint)*pbVar1 * 0x80) - 0x80;
      input->buffer_ = pbVar9 + 2;
    }
    else {
      input->buffer_ = pbVar1;
    }
    uVar14 = (ulong)uVar13 | 0x100000000;
  }
  else {
LAB_003c1a2a:
    uVar7 = io::CodedInputStream::ReadTagFallback(input,uVar7);
    uVar14 = 0;
    if (uVar7 - 1 < 0x3fff) {
      uVar14 = 0x100000000;
    }
    uVar14 = uVar7 | uVar14;
  }
  uVar13 = (uint)uVar14;
  if ((uVar14 & 0x100000000) != 0) {
    uVar6 = (uint)(uVar14 >> 3) & 0x1fffffff;
    cVar12 = (char)uVar14;
    if (uVar6 == 999) {
      if (cVar12 != ':') goto LAB_003c1883;
      this_01 = internal::RepeatedPtrFieldBase::
                Add<google::protobuf::RepeatedPtrField<google::protobuf::UninterpretedOption>::TypeHandler>
                          (&(this->uninterpreted_option_).super_RepeatedPtrFieldBase,(Type *)0x0);
      puVar3 = input->buffer_;
      if ((puVar3 < input->buffer_end_) && (byte_limit = (int)(char)*puVar3, -1 < byte_limit)) {
        input->buffer_ = puVar3 + 1;
      }
      else {
        byte_limit = io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        if (byte_limit < 0) {
          return false;
        }
      }
      pVar8 = io::CodedInputStream::IncrementRecursionDepthAndPushLimit(input,byte_limit);
      if ((long)pVar8 < 0) {
        return false;
      }
      bVar4 = UninterpretedOption::MergePartialFromCodedStream(this_01,input);
      if (!bVar4) {
        return false;
      }
      bVar4 = io::CodedInputStream::DecrementRecursionDepthAndPopLimit(input,pVar8.first);
      if (!bVar4) {
        return false;
      }
      goto LAB_003c1822;
    }
    if (uVar6 == 3) {
      if (cVar12 != '\x18') goto LAB_003c1883;
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
      pbVar9 = input->buffer_;
      pbVar10 = &this->deprecated_;
      if ((pbVar9 < input->buffer_end_) && (bVar5 = *pbVar9, -1 < (char)bVar5)) {
LAB_003c196c:
        uVar14 = (ulong)bVar5;
        input->buffer_ = pbVar9 + 1;
      }
      else {
        pVar15 = io::CodedInputStream::ReadVarint64Fallback(input);
        uVar14 = pVar15.first;
        if (((undefined1  [16])pVar15 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          return false;
        }
      }
LAB_003c19be:
      *pbVar10 = uVar14 != 0;
      goto LAB_003c1822;
    }
    if ((uVar6 == 2) && (cVar12 == '\x10')) {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
      pbVar9 = input->buffer_;
      pbVar10 = &this->allow_alias_;
      if ((pbVar9 < input->buffer_end_) && (bVar5 = *pbVar9, -1 < (char)bVar5)) goto LAB_003c196c;
      pVar15 = io::CodedInputStream::ReadVarint64Fallback(input);
      uVar14 = pVar15.first;
      if (((undefined1  [16])pVar15 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        return false;
      }
      goto LAB_003c19be;
    }
  }
LAB_003c1883:
  if (uVar13 == 0) {
    return true;
  }
  if ((uVar13 & 7) == 4) {
    return true;
  }
  pvVar2 = (this_00->
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           ).ptr_;
  if (uVar13 < 8000) {
    if (((ulong)pvVar2 & 1) == 0) {
      pUVar11 = internal::
                InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                ::mutable_unknown_fields_slow
                          (&this_00->
                            super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                          );
    }
    else {
      pUVar11 = (UnknownFieldSet *)((ulong)pvVar2 & 0xfffffffffffffffe);
    }
    bVar4 = internal::WireFormat::SkipField(input,uVar13,pUVar11);
  }
  else {
    if (((ulong)pvVar2 & 1) == 0) {
      pUVar11 = internal::
                InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                ::mutable_unknown_fields_slow
                          (&this_00->
                            super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                          );
    }
    else {
      pUVar11 = (UnknownFieldSet *)((ulong)pvVar2 & 0xfffffffffffffffe);
    }
    bVar4 = internal::ExtensionSet::ParseField
                      (&this->_extensions_,uVar13,input,(Message *)&_EnumOptions_default_instance_,
                       pUVar11);
  }
  if (bVar4 == false) {
    return false;
  }
  goto LAB_003c1822;
}

Assistant:

bool EnumOptions::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:google.protobuf.EnumOptions)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional bool allow_alias = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16u)) {
          set_has_allow_alias();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &allow_alias_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional bool deprecated = 3 [default = false];
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(24u)) {
          set_has_deprecated();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &deprecated_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
      case 999: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(7994u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_uninterpreted_option()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        if ((8000u <= tag)) {
          DO_(_extensions_.ParseField(tag, input, internal_default_instance(),
                                      mutable_unknown_fields()));
          continue;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:google.protobuf.EnumOptions)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:google.protobuf.EnumOptions)
  return false;
#undef DO_
}